

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.cpp
# Opt level: O3

void __thiscall
duckdb::roaring::ContainerMetadataCollection::Deserialize
          (ContainerMetadataCollection *this,data_ptr_t src,idx_t container_count)

{
  unsigned_long uVar1;
  byte *pbVar2;
  ulong uVar3;
  size_t __n;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  pointer puVar7;
  size_type __n_00;
  ulong uVar8;
  data_ptr_t __src;
  pointer puVar9;
  long lVar10;
  uint8_t *in;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,
             container_count + 0x1f & 0xffffffffffffffe0);
  this->count_in_segment = container_count;
  puVar9 = (this->container_type).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (long)(this->container_type).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar9;
  if ((uVar4 & 0x1f) != 0) {
    uVar1 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar4 & 0x1f);
    uVar4 = (uVar4 - uVar1) + 0x20;
    puVar9 = (this->container_type).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  uVar4 = uVar4 >> 2 & 0x1fffffffffffffff;
  if (container_count == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    do {
      lVar10 = 0;
      puVar7 = puVar9;
      do {
        duckdb_fastpforlib::internal::__fastunpack2
                  (src + lVar10 + (uVar5 >> 2 & 0x1ffffffffffffff8),puVar7);
        lVar10 = lVar10 + 2;
        puVar7 = puVar7 + 8;
      } while (lVar10 != 8);
      uVar5 = uVar5 + 0x20;
      puVar9 = puVar9 + 0x20;
    } while (uVar5 < container_count);
    uVar5 = 0;
    if (container_count != 0) {
      __n_00 = 0;
      do {
        pbVar2 = vector<unsigned_char,_true>::operator[](&this->container_type,__n_00);
        uVar5 = uVar5 + ((*pbVar2 >> 1 & 1) != 0);
        __n_00 = __n_00 + 1;
      } while (container_count != __n_00);
    }
  }
  __src = src + uVar4;
  this->runs_in_segment = uVar5;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&(this->number_of_runs).super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
             uVar5 + 0x1f & 0xffffffffffffffe0);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&(this->cardinality).super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
             container_count - uVar5);
  if (uVar5 != 0) {
    uVar3 = uVar5;
    if ((uVar5 & 0x1f) != 0) {
      uVar1 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar5 & 0x1f);
      uVar3 = (uVar5 - uVar1) + 0x20;
    }
    puVar9 = (this->number_of_runs).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = 0;
    uVar6 = 0;
    do {
      in = src + (uVar8 >> 3) + uVar4;
      lVar10 = 0;
      do {
        duckdb_fastpforlib::internal::__fastunpack7(in,puVar9 + lVar10);
        in = in + 7;
        lVar10 = lVar10 + 8;
      } while (lVar10 != 0x20);
      uVar6 = uVar6 + 0x20;
      uVar8 = uVar8 + 0xe0;
      puVar9 = puVar9 + 0x20;
    } while (uVar6 < uVar5);
    __src = __src + (uVar3 * 7 >> 3);
  }
  puVar9 = (this->cardinality).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar7 = (this->cardinality).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar9 == puVar7) {
    return;
  }
  __n = (long)puVar7 - (long)puVar9;
  this->arrays_in_segment = __n;
  switchD_015de399::default(puVar9,__src,__n);
  return;
}

Assistant:

void ContainerMetadataCollection::Deserialize(data_ptr_t src, idx_t container_count) {
	container_type.resize(AlignValue<idx_t, BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE>(container_count));
	count_in_segment = container_count;

	// Load the types of the containers
	idx_t types_size = BitpackingPrimitives::GetRequiredSize(container_type.size(), 2);
	BitpackingPrimitives::UnPackBuffer<uint8_t>(container_type.data(), src, container_count, 2, true);
	src += types_size;

	// Figure out how many are run containers
	idx_t runs_count = 0;
	for (idx_t i = 0; i < container_count; i++) {
		auto type = container_type[i];
		runs_count += ((type >> 1) & 1) == 1;
	}
	runs_in_segment = runs_count;
	number_of_runs.resize(AlignValue<idx_t, BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE>(runs_count));
	cardinality.resize(container_count - runs_count);

	// Load the run containers
	if (runs_count) {
		idx_t runs_size = BitpackingPrimitives::GetRequiredSize(runs_count, RUN_CONTAINER_SIZE_BITWIDTH);
		BitpackingPrimitives::UnPackBuffer<uint8_t>(number_of_runs.data(), src, runs_count, RUN_CONTAINER_SIZE_BITWIDTH,
		                                            true);
		src += runs_size;
	}

	// Load the array/bitset containers
	if (!cardinality.empty()) {
		idx_t arrays_size = sizeof(uint8_t) * cardinality.size();
		arrays_in_segment = arrays_size;
		memcpy(cardinality.data(), src, arrays_size);
	}
}